

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  int iVar1;
  int iVar2;
  deInt32 dVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  float fVar7;
  int local_ec;
  int local_e4;
  undefined8 local_ac;
  undefined8 local_a4;
  Matrix<float,_3,_3> local_9c;
  int local_78;
  int local_74;
  deInt32 minLevel;
  deInt32 maxLevel;
  float lodMin;
  float lodMax;
  float epsilon;
  float threshold;
  int unitNdx;
  Vector<float,_2> local_4c;
  Vec2 screenDerivate;
  Mat3 shrinkScaleMat;
  IVec2 *viewportSize_local;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *textureSizes_local;
  MultiTexShader *this_local;
  
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)&screenDerivate,makeSafeLods::shrinkScaleMatData);
  iVar1 = tcu::Vector<int,_2>::x(viewportSize);
  iVar2 = tcu::Vector<int,_2>::y(viewportSize);
  tcu::Vector<float,_2>::Vector(&local_4c,1.0 / (float)iVar1,1.0 / (float)iVar2);
  epsilon = 0.0;
LAB_019aa052:
  if (*(int *)&(this->super_ShaderProgram).field_0x154 <= (int)epsilon) {
    tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)&screenDerivate);
    return;
  }
  do {
    lodMax = 0.1;
    lodMin = 0.01;
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_lodDerivateParts,(long)(int)epsilon);
    pvVar5 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                       (textureSizes,(long)(int)epsilon);
    maxLevel = (deInt32)calculateLodMax(pvVar4,pvVar5,&local_4c);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_lodDerivateParts,(long)(int)epsilon);
    pvVar5 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                       (textureSizes,(long)(int)epsilon);
    minLevel = (deInt32)calculateLodMin(pvVar4,pvVar5,&local_4c);
    if (0.5 <= (float)maxLevel + 0.01) {
      dVar3 = ::deCeilFloatToInt32((float)maxLevel + 0.01 + 0.5);
      local_e4 = dVar3 + -1;
    }
    else {
      local_e4 = 0;
    }
    local_74 = local_e4;
    if (0.5 <= (float)minLevel - 0.01) {
      dVar3 = ::deCeilFloatToInt32((float)minLevel + -0.01 + 0.5);
      local_ec = dVar3 + -1;
    }
    else {
      local_ec = 0;
    }
    local_78 = local_ec;
    fVar7 = de::abs<float>((float)maxLevel);
    if (0.1 <= fVar7) {
      if (0.0 < (float)maxLevel) {
        fVar7 = deFloatFrac((float)maxLevel);
        fVar7 = de::abs<float>(fVar7 + -0.5);
        if (fVar7 < 0.1) goto LAB_019aa30a;
      }
      fVar7 = de::abs<float>((float)minLevel);
      if (0.1 <= fVar7) {
        if (0.0 < (float)minLevel) {
          fVar7 = deFloatFrac((float)minLevel);
          fVar7 = de::abs<float>(fVar7 + -0.5);
          if (fVar7 < 0.1) goto LAB_019aa30a;
        }
        if (local_74 == local_78) break;
      }
    }
LAB_019aa30a:
    pvVar6 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    tcu::operator*(&local_9c,(Matrix<float,_3,_3> *)&screenDerivate,pvVar6);
    pvVar6 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    tcu::Matrix<float,_3,_3>::operator=(pvVar6,&local_9c);
    tcu::Matrix<float,_3,_3>::~Matrix(&local_9c);
    pvVar6 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    calculateLodDerivateParts((Functional *)&local_ac,pvVar6);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_lodDerivateParts,(long)(int)epsilon);
    *(undefined8 *)pvVar4->m_data = local_ac;
    *(undefined8 *)(pvVar4->m_data + 2) = local_a4;
  } while( true );
  epsilon = (float)((int)epsilon + 1);
  goto LAB_019aa052;
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec2>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMatData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	Mat3 shrinkScaleMat(shrinkScaleMatData);

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = shrinkScaleMat * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}